

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LanguageDialect.cpp
# Opt level: O0

string * __thiscall psy::C::to_string_abi_cxx11_(string *__return_storage_ptr__,C *this,Std std)

{
  ostream *poVar1;
  allocator<char> local_28;
  allocator<char> local_27;
  allocator<char> local_26;
  allocator<char> local_25 [19];
  allocator<char> local_12;
  undefined1 local_11;
  string *psStack_10;
  Std std_local;
  
  local_11 = SUB81(this,0);
  psStack_10 = __return_storage_ptr__;
  switch((ulong)this & 0xff) {
  case 0:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"c89",&local_12);
    ::std::allocator<char>::~allocator(&local_12);
    break;
  case 1:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"c99",local_25);
    ::std::allocator<char>::~allocator(local_25);
    break;
  case 2:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"c11",&local_26);
    ::std::allocator<char>::~allocator(&local_26);
    break;
  case 3:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"c17",&local_27);
    ::std::allocator<char>::~allocator(&local_27);
    break;
  default:
    poVar1 = ::std::operator<<((ostream *)&::std::cout,"[ASSERT] at ");
    poVar1 = ::std::operator<<(poVar1,
                               "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/parser/LanguageDialect.cpp"
                              );
    poVar1 = ::std::operator<<(poVar1,":");
    poVar1 = (ostream *)::std::ostream::operator<<(poVar1,0x4f);
    poVar1 = ::std::operator<<(poVar1," ");
    poVar1 = ::std::operator<<(poVar1,"");
    ::std::ostream::operator<<(poVar1,::std::endl<char,std::char_traits<char>>);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_28);
    ::std::allocator<char>::~allocator(&local_28);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(LanguageDialect::Std std)
{
    switch (std) {
        case LanguageDialect::Std::C89_90:
            return "c89";

        case LanguageDialect::Std::C99:
            return "c99";

        case LanguageDialect::Std::C11:
            return "c11";

        case LanguageDialect::Std::C17_18:
            return "c17";

        default:
            PSY_ASSERT_3(false, return "", "");
    }
}